

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

bool __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  cmCPackLog *logger;
  byte bVar1;
  bool bVar2;
  bool genPostRm;
  bool permissionStrictPolicy;
  string *psVar3;
  mapped_type *pmVar4;
  bool local_179a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1440;
  allocator<char> local_1421;
  string local_1420;
  allocator<char> local_13f9;
  string local_13f8;
  cmValue local_13d8;
  string local_13d0;
  allocator<char> local_13a9;
  string local_13a8;
  string local_1388;
  allocator<char> local_1361;
  string local_1360;
  string local_1340;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1320;
  allocator<char> local_12e9;
  string local_12e8;
  cmValue local_12c8;
  allocator<char> local_12b9;
  string local_12b8;
  cmValue local_1298;
  allocator<char> local_1289;
  string local_1288;
  cmValue local_1268;
  allocator<char> local_1259;
  string local_1258;
  cmValue local_1238;
  string local_1230;
  allocator<char> local_1209;
  string local_1208;
  cmValue local_11e8;
  string local_11e0;
  string local_11c0;
  allocator<char> local_1199;
  string local_1198;
  cmValue local_1178;
  string local_1170;
  undefined1 local_1150 [8];
  DebGenerator gen;
  cmGeneratedFileStream out_2;
  string local_d38;
  undefined1 local_d18 [8];
  cmGeneratedFileStream out_1;
  string local_aa8;
  undefined1 local_a88 [8];
  string postrm;
  string postinst;
  undefined1 local_a40 [8];
  cmGeneratedFileStream out;
  allocator<char> local_7c9;
  string local_7c8;
  byte local_7a2;
  allocator<char> local_7a1;
  undefined1 local_7a0 [6];
  bool gen_shibs;
  cmValue local_780;
  cmValue debian_pkg_shlibs;
  string shlibsfilename;
  string local_750;
  cmValue local_730;
  undefined1 local_728 [8];
  string strGenWDIR;
  key_type local_700;
  string *local_6e0;
  allocator<char> local_6d1;
  string local_6d0;
  cmValue local_6b0;
  cmValue debian_pkg_replaces;
  key_type local_6a0;
  string *local_680;
  allocator<char> local_671;
  string local_670;
  cmValue local_650;
  cmValue debian_pkg_provides;
  key_type local_640;
  string *local_620;
  allocator<char> local_611;
  string local_610;
  cmValue local_5f0;
  cmValue debian_pkg_conflicts;
  key_type local_5e0;
  string *local_5c0;
  allocator<char> local_5b1;
  string local_5b0;
  cmValue local_590;
  cmValue debian_pkg_breaks;
  key_type local_580;
  string *local_560;
  allocator<char> local_551;
  string local_550;
  cmValue local_530;
  cmValue debian_pkg_enhances;
  key_type local_520;
  string *local_500;
  allocator<char> local_4f1;
  string local_4f0;
  cmValue local_4d0;
  cmValue debian_pkg_predep;
  key_type local_4c0;
  string *local_4a0;
  allocator<char> local_491;
  string local_490;
  cmValue local_470;
  cmValue debian_pkg_url;
  key_type local_460;
  string *local_440;
  allocator<char> local_431;
  string local_430;
  cmValue local_410;
  cmValue debian_pkg_sug;
  key_type local_400;
  string *local_3e0;
  allocator<char> local_3d1;
  string local_3d0;
  cmValue local_3b0;
  cmValue debian_pkg_rec;
  key_type local_3a0;
  string *local_380;
  allocator<char> local_371;
  string local_370;
  cmValue local_350;
  cmValue debian_pkg_dep;
  key_type local_340;
  string *local_320;
  allocator<char> local_311;
  string local_310;
  cmValue local_2f0;
  cmValue debian_pkg_source;
  key_type local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  cmValue local_298;
  allocator<char> local_289;
  key_type local_288;
  allocator<char> local_261;
  string local_260;
  cmValue local_240;
  allocator<char> local_231;
  key_type local_230;
  allocator<char> local_209;
  string local_208;
  cmValue local_1e8;
  allocator<char> local_1d9;
  key_type local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  cmValue local_190;
  allocator<char> local_181;
  key_type local_180;
  allocator<char> local_159;
  string local_158;
  cmValue local_138;
  allocator<char> local_129;
  key_type local_128;
  allocator<char> local_101;
  string local_100;
  cmValue local_e0;
  allocator<char> local_d1;
  key_type local_d0;
  allocator<char> local_99;
  string local_98;
  cmValue local_78;
  string local_70;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues;
  cmCPackDebGenerator *this_local;
  
  controlValues._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"GEN_CPACK_DEBIAN_PACKAGE_NAME",&local_99);
  local_78 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_98);
  psVar3 = cmValue::operator_cast_to_string_(&local_78);
  cmsys::SystemTools::LowerCase(&local_70,psVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Package",&local_d1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_d0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"GEN_CPACK_DEBIAN_PACKAGE_VERSION",&local_101);
  local_e0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_100);
  psVar3 = cmValue::operator*[abi_cxx11_(&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"Version",&local_129);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_128);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"GEN_CPACK_DEBIAN_PACKAGE_SECTION",&local_159);
  local_138 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_158);
  psVar3 = cmValue::operator*[abi_cxx11_(&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"Section",&local_181);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_180);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY",&local_1b1);
  local_190 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1b0);
  psVar3 = cmValue::operator*[abi_cxx11_(&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"Priority",&local_1d9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE",&local_209);
  local_1e8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_208);
  psVar3 = cmValue::operator*[abi_cxx11_(&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Architecture",&local_231)
  ;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_230);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER",&local_261);
  local_240 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_260);
  psVar3 = cmValue::operator*[abi_cxx11_(&local_240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"Maintainer",&local_289);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_288);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION",&local_2b9);
  local_298 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2b8);
  psVar3 = cmValue::operator*[abi_cxx11_(&local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"Description",
             (allocator<char> *)((long)&debian_pkg_source.Value + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_2e0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_source.Value + 7));
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE",&local_311);
  local_2f0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  local_320 = local_2f0.Value;
  bVar2 = cmNonempty(local_2f0);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_2f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"Source",(allocator<char> *)((long)&debian_pkg_dep.Value + 7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_340);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_dep.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS",&local_371);
  local_350 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  local_380 = local_350.Value;
  bVar2 = cmNonempty(local_350);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_350);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"Depends",(allocator<char> *)((long)&debian_pkg_rec.Value + 7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_3a0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_rec.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS",&local_3d1);
  local_3b0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  local_3e0 = local_3b0.Value;
  bVar2 = cmNonempty(local_3b0);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"Recommends",
               (allocator<char> *)((long)&debian_pkg_sug.Value + 7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_400);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_sug.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS",&local_431);
  local_410 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  local_440 = local_410.Value;
  bVar2 = cmNonempty(local_410);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_410);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"Suggests",(allocator<char> *)((long)&debian_pkg_url.Value + 7))
    ;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_460);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_url.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE",&local_491);
  local_470 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  local_4a0 = local_470.Value;
  bVar2 = cmNonempty(local_470);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_470);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"Homepage",
               (allocator<char> *)((long)&debian_pkg_predep.Value + 7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_4c0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_predep.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS",&local_4f1);
  local_4d0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  local_500 = local_4d0.Value;
  bVar2 = cmNonempty(local_4d0);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_4d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,"Pre-Depends",
               (allocator<char> *)((long)&debian_pkg_enhances.Value + 7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_520);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_enhances.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES",&local_551);
  local_530 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  local_560 = local_530.Value;
  bVar2 = cmNonempty(local_530);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_530);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,"Enhances",
               (allocator<char> *)((long)&debian_pkg_breaks.Value + 7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_580);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_580);
    std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_breaks.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b0,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS",&local_5b1);
  local_590 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  local_5c0 = local_590.Value;
  bVar2 = cmNonempty(local_590);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_590);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e0,"Breaks",
               (allocator<char> *)((long)&debian_pkg_conflicts.Value + 7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_5e0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_conflicts.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS",&local_611);
  local_5f0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_610);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator(&local_611);
  local_620 = local_5f0.Value;
  bVar2 = cmNonempty(local_5f0);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_5f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_640,"Conflicts",
               (allocator<char> *)((long)&debian_pkg_provides.Value + 7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_640);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_provides.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES",&local_671);
  local_650 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator(&local_671);
  local_680 = local_650.Value;
  bVar2 = cmNonempty(local_650);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_650);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a0,"Provides",
               (allocator<char> *)((long)&debian_pkg_replaces.Value + 7));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_6a0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_replaces.Value + 7));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES",&local_6d1);
  local_6b0 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_6d0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  local_6e0 = local_6b0.Value;
  bVar2 = cmNonempty(local_6b0);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_6b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_700,"Replaces",
               (allocator<char> *)(strGenWDIR.field_2._M_local_buf + 0xf));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_700);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator((allocator<char> *)(strGenWDIR.field_2._M_local_buf + 0xf));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,"GEN_WDIR",
             (allocator<char> *)(shlibsfilename.field_2._M_local_buf + 0xf));
  local_730 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_750);
  psVar3 = cmValue::operator_cast_to_string_(&local_730);
  std::__cxx11::string::string((string *)local_728,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator((allocator<char> *)(shlibsfilename.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &debian_pkg_shlibs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_728,
                 "/shlibs");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_7a0,"GEN_CPACK_DEBIAN_PACKAGE_SHLIBS",&local_7a1);
  local_780 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_7a0);
  std::__cxx11::string::~string((string *)local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,"CPACK_DEBIAN_PACKAGE_GENERATE_SHLIBS",&local_7c9);
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_7c8);
  local_179a = false;
  if (bVar2) {
    out._608_8_ = local_780.Value;
    local_179a = cmNonempty(local_780);
  }
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator(&local_7c9);
  local_7a2 = local_179a;
  if (local_179a != false) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_a40,None);
    cmGeneratedFileStream::Open
              ((cmGeneratedFileStream *)local_a40,(string *)&debian_pkg_shlibs,false,true);
    ::operator<<((ostream *)local_a40,local_780);
    std::operator<<((ostream *)local_a40,'\n');
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_a40);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&postrm.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_728,
                 "/postinst");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_728,
                 "/postrm");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_aa8,"GEN_CPACK_DEBIAN_GENERATE_POSTINST",
             (allocator<char> *)&out_1.field_0x267);
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_aa8);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::allocator<char>::~allocator((allocator<char> *)&out_1.field_0x267);
  if (bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_d18,None);
    cmGeneratedFileStream::Open
              ((cmGeneratedFileStream *)local_d18,(string *)((long)&postrm.field_2 + 8),false,true);
    std::operator<<((ostream *)local_d18,
                    "#!/bin/sh\n\nset -e\n\nif [ \"$1\" = \"configure\" ]; then\n\tldconfig\nfi\n");
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_d18);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d38,"GEN_CPACK_DEBIAN_GENERATE_POSTRM",
             (allocator<char> *)&out_2.field_0x267);
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_d38);
  std::__cxx11::string::~string((string *)&local_d38);
  std::allocator<char>::~allocator((allocator<char> *)&out_2.field_0x267);
  if (bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&gen.TarCompressionType,None);
    cmGeneratedFileStream::Open
              ((cmGeneratedFileStream *)&gen.TarCompressionType,(string *)local_a88,false,true);
    std::operator<<((ostream *)&gen.TarCompressionType,
                    "#!/bin/sh\n\nset -e\n\nif [ \"$1\" = \"remove\" ]; then\n\tldconfig\nfi\n");
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen.TarCompressionType);
  }
  logger = (this->super_cmCPackGenerator).Logger;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1198,"GEN_CPACK_OUTPUT_FILE_NAME",&local_1199);
  local_1178 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1198);
  psVar3 = cmValue::operator_cast_to_string_(&local_1178);
  std::__cxx11::string::string((string *)&local_1170,(string *)psVar3);
  std::__cxx11::string::string((string *)&local_11c0,(string *)local_728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1208,"CPACK_TOPLEVEL_DIRECTORY",&local_1209);
  local_11e8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1208);
  psVar3 = cmValue::operator_cast_to_string_(&local_11e8);
  std::__cxx11::string::string((string *)&local_11e0,(string *)psVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1258,"CPACK_TEMPORARY_DIRECTORY",&local_1259);
  local_1238 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1258);
  psVar3 = cmValue::operator_cast_to_string_(&local_1238);
  std::__cxx11::string::string((string *)&local_1230,(string *)psVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1288,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE",&local_1289);
  local_1268 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12b8,"CPACK_THREADS",&local_12b9);
  local_1298 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_12b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12e8,"GEN_CPACK_DEBIAN_ARCHIVE_TYPE",&local_12e9);
  local_12c8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_12e8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_1320,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  bVar1 = local_7a2;
  std::__cxx11::string::string((string *)&local_1340,(string *)&debian_pkg_shlibs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1360,"GEN_CPACK_DEBIAN_GENERATE_POSTINST",&local_1361);
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_1360);
  std::__cxx11::string::string((string *)&local_1388,(string *)(postrm.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13a8,"GEN_CPACK_DEBIAN_GENERATE_POSTRM",&local_13a9);
  genPostRm = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_13a8);
  std::__cxx11::string::string((string *)&local_13d0,(string *)local_a88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13f8,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA",&local_13f9);
  local_13d8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_13f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1420,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION",&local_1421)
  ;
  permissionStrictPolicy = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1420);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1440,&this->packageFiles);
  anon_unknown.dwarf_12e9c1::DebGenerator::DebGenerator
            ((DebGenerator *)local_1150,logger,&local_1170,&local_11c0,&local_11e0,&local_1230,
             local_1268,local_1298,local_12c8,&local_1320,(bool)(bVar1 & 1),&local_1340,bVar2,
             &local_1388,genPostRm,&local_13d0,local_13d8,permissionStrictPolicy,&local_1440);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1440);
  std::__cxx11::string::~string((string *)&local_1420);
  std::allocator<char>::~allocator(&local_1421);
  std::__cxx11::string::~string((string *)&local_13f8);
  std::allocator<char>::~allocator(&local_13f9);
  std::__cxx11::string::~string((string *)&local_13d0);
  std::__cxx11::string::~string((string *)&local_13a8);
  std::allocator<char>::~allocator(&local_13a9);
  std::__cxx11::string::~string((string *)&local_1388);
  std::__cxx11::string::~string((string *)&local_1360);
  std::allocator<char>::~allocator(&local_1361);
  std::__cxx11::string::~string((string *)&local_1340);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_1320);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::allocator<char>::~allocator(&local_12e9);
  std::__cxx11::string::~string((string *)&local_12b8);
  std::allocator<char>::~allocator(&local_12b9);
  std::__cxx11::string::~string((string *)&local_1288);
  std::allocator<char>::~allocator(&local_1289);
  std::__cxx11::string::~string((string *)&local_1230);
  std::__cxx11::string::~string((string *)&local_1258);
  std::allocator<char>::~allocator(&local_1259);
  std::__cxx11::string::~string((string *)&local_11e0);
  std::__cxx11::string::~string((string *)&local_1208);
  std::allocator<char>::~allocator(&local_1209);
  std::__cxx11::string::~string((string *)&local_11c0);
  std::__cxx11::string::~string((string *)&local_1170);
  std::__cxx11::string::~string((string *)&local_1198);
  std::allocator<char>::~allocator(&local_1199);
  bVar2 = anon_unknown.dwarf_12e9c1::DebGenerator::generate((DebGenerator *)local_1150);
  anon_unknown.dwarf_12e9c1::DebGenerator::~DebGenerator((DebGenerator *)local_1150);
  std::__cxx11::string::~string((string *)local_a88);
  std::__cxx11::string::~string((string *)(postrm.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&debian_pkg_shlibs);
  std::__cxx11::string::~string((string *)local_728);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return bVar2;
}

Assistant:

bool cmCPackDebGenerator::createDeb()
{
  std::map<std::string, std::string> controlValues;

  // debian policy enforce lower case for package name
  controlValues["Package"] = cmsys::SystemTools::LowerCase(
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME"));
  controlValues["Version"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  controlValues["Section"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  controlValues["Priority"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  controlValues["Architecture"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  controlValues["Maintainer"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  controlValues["Description"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  cmValue debian_pkg_source =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");
  if (cmNonempty(debian_pkg_source)) {
    controlValues["Source"] = *debian_pkg_source;
  }
  cmValue debian_pkg_dep = this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  if (cmNonempty(debian_pkg_dep)) {
    controlValues["Depends"] = *debian_pkg_dep;
  }
  cmValue debian_pkg_rec =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  if (cmNonempty(debian_pkg_rec)) {
    controlValues["Recommends"] = *debian_pkg_rec;
  }
  cmValue debian_pkg_sug =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  if (cmNonempty(debian_pkg_sug)) {
    controlValues["Suggests"] = *debian_pkg_sug;
  }
  cmValue debian_pkg_url =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  if (cmNonempty(debian_pkg_url)) {
    controlValues["Homepage"] = *debian_pkg_url;
  }
  cmValue debian_pkg_predep =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  if (cmNonempty(debian_pkg_predep)) {
    controlValues["Pre-Depends"] = *debian_pkg_predep;
  }
  cmValue debian_pkg_enhances =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  if (cmNonempty(debian_pkg_enhances)) {
    controlValues["Enhances"] = *debian_pkg_enhances;
  }
  cmValue debian_pkg_breaks =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  if (cmNonempty(debian_pkg_breaks)) {
    controlValues["Breaks"] = *debian_pkg_breaks;
  }
  cmValue debian_pkg_conflicts =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  if (cmNonempty(debian_pkg_conflicts)) {
    controlValues["Conflicts"] = *debian_pkg_conflicts;
  }
  cmValue debian_pkg_provides =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  if (cmNonempty(debian_pkg_provides)) {
    controlValues["Provides"] = *debian_pkg_provides;
  }
  cmValue debian_pkg_replaces =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");
  if (cmNonempty(debian_pkg_replaces)) {
    controlValues["Replaces"] = *debian_pkg_replaces;
  }

  const std::string strGenWDIR(this->GetOption("GEN_WDIR"));
  const std::string shlibsfilename = strGenWDIR + "/shlibs";

  cmValue debian_pkg_shlibs =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SHLIBS");
  const bool gen_shibs = this->IsOn("CPACK_DEBIAN_PACKAGE_GENERATE_SHLIBS") &&
    cmNonempty(debian_pkg_shlibs);
  if (gen_shibs) {
    cmGeneratedFileStream out;
    out.Open(shlibsfilename, false, true);
    out << debian_pkg_shlibs;
    out << '\n';
  }

  const std::string postinst = strGenWDIR + "/postinst";
  const std::string postrm = strGenWDIR + "/postrm";
  if (this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTINST")) {
    cmGeneratedFileStream out;
    out.Open(postinst, false, true);
    out << "#!/bin/sh\n\n"
           "set -e\n\n"
           "if [ \"$1\" = \"configure\" ]; then\n"
           "\tldconfig\n"
           "fi\n";
  }
  if (this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTRM")) {
    cmGeneratedFileStream out;
    out.Open(postrm, false, true);
    out << "#!/bin/sh\n\n"
           "set -e\n\n"
           "if [ \"$1\" = \"remove\" ]; then\n"
           "\tldconfig\n"
           "fi\n";
  }

  DebGenerator gen(
    this->Logger, this->GetOption("GEN_CPACK_OUTPUT_FILE_NAME"), strGenWDIR,
    this->GetOption("CPACK_TOPLEVEL_DIRECTORY"),
    this->GetOption("CPACK_TEMPORARY_DIRECTORY"),
    this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE"),
    this->GetOption("CPACK_THREADS"),
    this->GetOption("GEN_CPACK_DEBIAN_ARCHIVE_TYPE"), controlValues, gen_shibs,
    shlibsfilename, this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTINST"), postinst,
    this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTRM"), postrm,
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA"),
    this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION"),
    this->packageFiles);

  return gen.generate();
}